

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O0

void __thiscall
Assimp::MDLImporter::ParseBoneTrafoKeys_3DGS_MDL7
          (MDLImporter *this,IntGroupInfo_MDL7 *groupInfo,IntFrameInfo_MDL7 *frame,
          IntSharedData_MDL7 *shared)

{
  uchar *puVar1;
  Logger *pLVar2;
  uint local_3c;
  BoneTransform_MDL7 *pBStack_38;
  uint iTrafo;
  BoneTransform_MDL7 *pcBoneTransforms;
  Header_MDL7 *pcHeader;
  IntSharedData_MDL7 *shared_local;
  IntFrameInfo_MDL7 *frame_local;
  IntGroupInfo_MDL7 *groupInfo_local;
  MDLImporter *this_local;
  
  puVar1 = this->mBuffer;
  if (frame->pcFrame->transmatrix_count != 0) {
    if (groupInfo->iIndex == 0) {
      pBStack_38 = (BoneTransform_MDL7 *)
                   (frame->pcFrame->frame_name +
                   (ulong)(frame->pcFrame->vertices_count * (uint)*(ushort *)(puVar1 + 0x2a)) +
                   (long)(int)(uint)*(ushort *)(puVar1 + 0x2e));
      for (local_3c = 0; local_3c < frame->pcFrame->transmatrix_count; local_3c = local_3c + 1) {
        if ((uint)pBStack_38->bone_index < *(uint *)(puVar1 + 8)) {
          AddAnimationBoneTrafoKey_3DGS_MDL7(this,frame->iIndex,pBStack_38,shared->apcOutBones);
        }
        else {
          pLVar2 = DefaultLogger::get();
          Logger::warn(pLVar2,
                       "Index overflow in frame area. Unable to parse this bone transformation");
        }
        pBStack_38 = (BoneTransform_MDL7 *)
                     ((long)pBStack_38->m + (long)(int)(uint)*(ushort *)(puVar1 + 0x2c));
      }
    }
    else {
      pLVar2 = DefaultLogger::get();
      Logger::warn(pLVar2,"Ignoring animation keyframes in groups != 0");
    }
  }
  return;
}

Assistant:

void MDLImporter::ParseBoneTrafoKeys_3DGS_MDL7(
    const MDL::IntGroupInfo_MDL7& groupInfo,
    IntFrameInfo_MDL7&            frame,
    MDL::IntSharedData_MDL7&      shared)
{
    const MDL::Header_MDL7* const pcHeader = (const MDL::Header_MDL7*)this->mBuffer;

    // only the first group contains bone animation keys
    if (frame.pcFrame->transmatrix_count)   {
        if (!groupInfo.iIndex)  {
            // skip all frames vertices. We can't support them
            const MDL::BoneTransform_MDL7* pcBoneTransforms = (const MDL::BoneTransform_MDL7*)
                (((const char*)frame.pcFrame) + pcHeader->frame_stc_size +
                frame.pcFrame->vertices_count * pcHeader->framevertex_stc_size);

            // read all transformation matrices
            for (unsigned int iTrafo = 0; iTrafo < frame.pcFrame->transmatrix_count;++iTrafo)   {
                if(pcBoneTransforms->bone_index >= pcHeader->bones_num) {
                    ASSIMP_LOG_WARN("Index overflow in frame area. "
                        "Unable to parse this bone transformation");
                }
                else    {
                    AddAnimationBoneTrafoKey_3DGS_MDL7(frame.iIndex,
                        pcBoneTransforms,shared.apcOutBones);
                }
                pcBoneTransforms = (const MDL::BoneTransform_MDL7*)(
                    (const char*)pcBoneTransforms + pcHeader->bonetrans_stc_size);
            }
        }
        else    {
            ASSIMP_LOG_WARN("Ignoring animation keyframes in groups != 0");
        }
    }
}